

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O1

Node48 * duckdb::Node48::ShrinkNode256(ART *art,Node *node48,Node *node256)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  Node48 *pNVar3;
  type paVar4;
  long *plVar5;
  pointer this;
  data_ptr_t pdVar6;
  long lVar7;
  byte bVar8;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  
  pNVar3 = New(art,node48);
  uVar1 = (node256->super_IndexPointer).data;
  paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar4->_M_elems[5].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar1 & 0xffffffff;
  plVar5 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
  for (plVar10 = (long *)*plVar5; uVar9 != plVar10[1]; plVar10 = (long *)*plVar10) {
    plVar5 = plVar10;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar5 + 0x10));
  pdVar6 = FixedSizeBuffer::Get(this,true);
  pdVar6 = pdVar6 + (_Var2._M_head_impl)->bitmask_offset +
                    (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  (node48->super_IndexPointer).data =
       (node256->super_IndexPointer).data & 0x8000000000000000 |
       (node48->super_IndexPointer).data & 0x7fffffffffffffff;
  pNVar3->count = '\0';
  lVar7 = 1;
  bVar8 = 0;
  do {
    if (pdVar6[lVar7 * 8 + 7] == '\0') {
      pNVar3->child_index[lVar7 + -1] = '0';
    }
    else {
      pNVar3->child_index[lVar7 + -1] = bVar8;
      pNVar3->children[bVar8].super_IndexPointer.data = *(idx_t *)(pdVar6 + lVar7 * 8);
      bVar8 = bVar8 + 1;
      pNVar3->count = bVar8;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x101);
  bVar8 = pNVar3->count;
  if ((ulong)bVar8 < 0x30) {
    switchD_005700f1::default(pNVar3->children + bVar8,0,(ulong)(byte)(0x2f - bVar8) * 8 + 8);
  }
  pdVar6[0] = '\0';
  pdVar6[1] = '\0';
  Node::Free(art,node256);
  return pNVar3;
}

Assistant:

Node48 &Node48::ShrinkNode256(ART &art, Node &node48, Node &node256) {
	auto &n48 = New(art, node48);
	auto &n256 = Node::Ref<Node256>(art, node256, NType::NODE_256);
	node48.SetGateStatus(node256.GetGateStatus());

	n48.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (!n256.children[i].HasMetadata()) {
			n48.child_index[i] = EMPTY_MARKER;
			continue;
		}
		n48.child_index[i] = n48.count;
		n48.children[n48.count] = n256.children[i];
		n48.count++;
	}
	for (uint8_t i = n48.count; i < CAPACITY; i++) {
		n48.children[i].Clear();
	}

	n256.count = 0;
	Node::Free(art, node256);
	return n48;
}